

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

hash_code llvm::hash_value(APInt *Arg)

{
  unsigned_long *first;
  uint64_t *puVar1;
  bool bVar2;
  uint uVar3;
  APInt *Arg_local;
  
  bVar2 = APInt::isSingleWord(Arg);
  if (bVar2) {
    Arg_local = (APInt *)hash_combine<unsigned_long>((unsigned_long *)Arg);
  }
  else {
    first = (Arg->U).pVal;
    puVar1 = (Arg->U).pVal;
    uVar3 = APInt::getNumWords(Arg);
    Arg_local = (APInt *)hash_combine_range<unsigned_long*>(first,puVar1 + uVar3);
  }
  return (hash_code)(size_t)Arg_local;
}

Assistant:

hash_code llvm::hash_value(const APInt &Arg) {
  if (Arg.isSingleWord())
    return hash_combine(Arg.U.VAL);

  return hash_combine_range(Arg.U.pVal, Arg.U.pVal + Arg.getNumWords());
}